

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O1

void toml::detail::skip_string_like<toml::type_config>
               (location *loc,context<toml::type_config> *param_2)

{
  element_type *peVar1;
  long lVar2;
  element_type *peVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  literal local_b0;
  region local_98;
  
  local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005758b0;
  local_b0.value_ = "\"\"\"";
  local_b0.size_ = 3;
  literal::scan(&local_98,&local_b0,loc);
  peVar1 = local_98.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  region::~region(&local_98);
  if (peVar1 == (element_type *)0x0) {
    local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005758b0;
    local_b0.value_ = "\'\'\'";
    local_b0.size_ = 3;
    literal::scan(&local_98,&local_b0,loc);
    peVar3 = local_98.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    region::~region(&local_98);
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar5 = loc->location_;
    lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar2;
    if (peVar3 == (element_type *)0x0) {
      if (uVar5 < uVar6) {
        if (*(char *)(lVar2 + uVar5) == '\"') {
          if (loc->location_ < uVar6) {
            sVar4 = loc->line_number_;
            sVar8 = loc->column_number_;
            uVar5 = loc->location_;
            do {
              if (uVar5 + 1 < uVar6) {
                if (*(char *)(lVar2 + uVar5) == '\n') {
                  sVar4 = sVar4 + 1;
                  loc->line_number_ = sVar4;
                  sVar8 = 1;
                }
                else {
                  sVar8 = sVar8 + 1;
                }
                loc->column_number_ = sVar8;
                uVar7 = uVar5 + 1;
              }
              else {
                for (; uVar7 = uVar6, uVar6 != uVar5; uVar5 = uVar5 + 1) {
                  if (*(char *)(lVar2 + uVar5) == '\n') {
                    sVar4 = sVar4 + 1;
                    loc->line_number_ = sVar4;
                    sVar8 = 1;
                  }
                  else {
                    sVar8 = sVar8 + 1;
                  }
                  loc->column_number_ = sVar8;
                }
              }
              loc->location_ = uVar7;
              if ((uVar7 < uVar6) &&
                 ((*(char *)(lVar2 + uVar7) == '\"' ||
                  ((uVar7 < uVar6 && (*(char *)(lVar2 + uVar7) == '\n')))))) {
                uVar5 = uVar7 + 1;
                if (uVar5 < uVar6) {
LAB_003e4d93:
                  if (*(char *)(lVar2 + uVar7) == '\n') {
                    loc->line_number_ = loc->line_number_ + 1;
                    sVar4 = 1;
                  }
                  else {
                    sVar4 = loc->column_number_ + 1;
                  }
                  loc->column_number_ = sVar4;
                  uVar6 = uVar5;
                }
                else if (uVar6 != uVar7) {
                  sVar4 = loc->line_number_;
                  sVar8 = loc->column_number_;
                  do {
                    if (*(char *)(lVar2 + uVar7) == '\n') {
                      sVar4 = sVar4 + 1;
                      loc->line_number_ = sVar4;
                      sVar8 = 1;
                    }
                    else {
                      sVar8 = sVar8 + 1;
                    }
                    loc->column_number_ = sVar8;
                    uVar7 = uVar7 + 1;
                  } while (uVar6 != uVar7);
                }
LAB_003e4de4:
                loc->location_ = uVar6;
                return;
              }
              uVar5 = uVar7;
            } while (uVar7 < uVar6);
          }
        }
        else if (((uVar5 < uVar6) && (*(char *)(lVar2 + uVar5) == '\'')) && (loc->location_ < uVar6)
                ) {
          sVar4 = loc->line_number_;
          sVar8 = loc->column_number_;
          uVar5 = loc->location_;
          do {
            if (uVar5 + 1 < uVar6) {
              if (*(char *)(lVar2 + uVar5) == '\n') {
                sVar4 = sVar4 + 1;
                loc->line_number_ = sVar4;
                sVar8 = 1;
              }
              else {
                sVar8 = sVar8 + 1;
              }
              loc->column_number_ = sVar8;
              uVar7 = uVar5 + 1;
            }
            else {
              for (; uVar7 = uVar6, uVar6 != uVar5; uVar5 = uVar5 + 1) {
                if (*(char *)(lVar2 + uVar5) == '\n') {
                  sVar4 = sVar4 + 1;
                  loc->line_number_ = sVar4;
                  sVar8 = 1;
                }
                else {
                  sVar8 = sVar8 + 1;
                }
                loc->column_number_ = sVar8;
              }
            }
            loc->location_ = uVar7;
            if ((uVar7 < uVar6) &&
               ((*(char *)(lVar2 + uVar7) == '\'' ||
                ((uVar7 < uVar6 && (*(char *)(lVar2 + uVar7) == '\n')))))) {
              uVar5 = uVar7 + 1;
              if (uVar5 < uVar6) goto LAB_003e4d93;
              if (uVar6 != uVar7) {
                sVar4 = loc->line_number_;
                sVar8 = loc->column_number_;
                do {
                  if (*(char *)(lVar2 + uVar7) == '\n') {
                    sVar4 = sVar4 + 1;
                    loc->line_number_ = sVar4;
                    sVar8 = 1;
                  }
                  else {
                    sVar8 = sVar8 + 1;
                  }
                  loc->column_number_ = sVar8;
                  uVar7 = uVar7 + 1;
                } while (uVar6 != uVar7);
              }
              goto LAB_003e4de4;
            }
            uVar5 = uVar7;
          } while (uVar7 < uVar6);
        }
      }
    }
    else if (uVar5 < uVar6) {
      do {
        local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005758b0;
        local_b0.value_ = "\'\'\'";
        local_b0.size_ = 3;
        literal::scan(&local_98,&local_b0,loc);
        peVar1 = local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        region::~region(&local_98);
        if (peVar1 != (element_type *)0x0) {
          return;
        }
        peVar1 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar5 = loc->location_;
        lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - lVar2;
        if (uVar5 + 1 < uVar6) {
          if (*(char *)(lVar2 + uVar5) == '\n') {
            loc->line_number_ = loc->line_number_ + 1;
            sVar4 = 1;
          }
          else {
            sVar4 = loc->column_number_ + 1;
          }
          loc->column_number_ = sVar4;
          uVar6 = uVar5 + 1;
        }
        else if (uVar6 != uVar5) {
          sVar4 = loc->line_number_;
          sVar8 = loc->column_number_;
          do {
            if (*(char *)(lVar2 + uVar5) == '\n') {
              sVar4 = sVar4 + 1;
              loc->line_number_ = sVar4;
              sVar8 = 1;
            }
            else {
              sVar8 = sVar8 + 1;
            }
            loc->column_number_ = sVar8;
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        loc->location_ = uVar6;
        peVar1 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      } while (uVar6 < (ulong)((long)(peVar1->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(peVar1->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start));
    }
  }
  else {
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (loc->location_ <
        (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
      do {
        local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005758b0;
        local_b0.value_ = "\"\"\"";
        local_b0.size_ = 3;
        literal::scan(&local_98,&local_b0,loc);
        peVar1 = local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        region::~region(&local_98);
        if (peVar1 != (element_type *)0x0) {
          return;
        }
        peVar1 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar5 = loc->location_;
        lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - lVar2;
        if (uVar5 + 1 < uVar6) {
          if (*(char *)(lVar2 + uVar5) == '\n') {
            loc->line_number_ = loc->line_number_ + 1;
            sVar4 = 1;
          }
          else {
            sVar4 = loc->column_number_ + 1;
          }
          loc->column_number_ = sVar4;
          uVar6 = uVar5 + 1;
        }
        else if (uVar6 != uVar5) {
          sVar4 = loc->line_number_;
          sVar8 = loc->column_number_;
          do {
            if (*(char *)(lVar2 + uVar5) == '\n') {
              sVar4 = sVar4 + 1;
              loc->line_number_ = sVar4;
              sVar8 = 1;
            }
            else {
              sVar8 = sVar8 + 1;
            }
            loc->column_number_ = sVar8;
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        loc->location_ = uVar6;
        peVar1 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      } while (uVar6 < (ulong)((long)(peVar1->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(peVar1->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start));
    }
  }
  return;
}

Assistant:

void skip_string_like(location& loc, const context<TC>&)
{
    // if """ is found, skip until the closing """ is found.
    if(literal("\"\"\"").scan(loc).is_ok())
    {
        while( ! loc.eof())
        {
            if(literal("\"\"\"").scan(loc).is_ok())
            {
                return;
            }
            loc.advance();
        }
    }
    else if(literal("'''").scan(loc).is_ok())
    {
        while( ! loc.eof())
        {
            if(literal("'''").scan(loc).is_ok())
            {
                return;
            }
            loc.advance();
        }
    }
    // if " is found, skip until the closing " or newline is found.
    else if(loc.current() == '"')
    {
        while( ! loc.eof())
        {
            loc.advance();
            if(loc.current() == '"' || loc.current() == '\n')
            {
                loc.advance();
                return;
            }
        }
    }
    else if(loc.current() == '\'')
    {
        while( ! loc.eof())
        {
            loc.advance();
            if(loc.current() == '\'' || loc.current() == '\n')
            {
                loc.advance();
                return ;
            }
        }
    }
    return;
}